

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O2

string * __thiscall
trun::ResultsReportJSON::EscapeString
          (string *__return_storage_ptr__,ResultsReportJSON *this,string *str)

{
  char __c;
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  allocator<char> local_51;
  string strIllegal;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&strIllegal,"\"\\",&local_51);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (str->_M_dataplus)._M_p;
  sVar2 = str->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    __c = pcVar1[sVar4];
    if ('\x1e' < __c) {
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&strIllegal,__c,0);
      if (sVar3 != 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,'\\');
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,__c);
    }
  }
  std::__cxx11::string::~string((string *)&strIllegal);
  return __return_storage_ptr__;
}

Assistant:

std::string ResultsReportJSON::EscapeString(const std::string &str) {
    std::string strIllegal = "\"\\";
    std::string strEscaped;
    for(auto c : str) {
        // Just skip this - we do not forward tab's, bells, new lines and whatever...
        if (c < 31) continue;
        if (strIllegal.find(c) != std::string::npos) {
            strEscaped += '\\';
        }
        strEscaped += c;
    }

    return strEscaped;
}